

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

void __thiscall Liby::UdpSocket::UdpSocket(UdpSocket *this,EventLoop *loop,SockPtr *socket)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_Liby::Poller_*,_false> _Var5;
  Poller *pPVar6;
  pointer __p;
  
  (this->super_enable_shared_from_this<Liby::UdpSocket>)._M_weak_this.
  super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Liby::UdpSocket>)._M_weak_this.
  super___weak_ptr<Liby::UdpSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->destroy_ = false;
  peVar3 = (socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this->sockfd_ = peVar3->fd_;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  p_Var4 = (socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  _Var5._M_head_impl =
       (loop->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  if (_Var5._M_head_impl != (Poller *)0x0) {
    this->poller_ = _Var5._M_head_impl;
    this->loop_ = loop;
    (this->chan_)._M_t.super___uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>.
    _M_t.super__Tuple_impl<0UL,_Liby::Channel_*,_std::default_delete<Liby::Channel>_>.
    super__Head_base<0UL,_Liby::Channel_*,_false>._M_head_impl = (Channel *)0x0;
    p_Var1 = &(this->conns_)._M_t._M_impl.super__Rb_tree_header;
    (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    (this->conns_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_map_size = 0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    (this->writTasks_).super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    std::_Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::_M_initialize_map
              (&(this->writTasks_).
                super__Deque_base<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>,0);
    memset(&this->acceptorCallback_,0,0x90);
    __p = (pointer)operator_new(0x70);
    pPVar6 = this->poller_;
    iVar2 = this->sockfd_;
    (__p->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__p->erroEventCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
    (__p->writEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->writEventCallback_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__p->writEventCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->writEventCallback_).super__Function_base._M_functor + 8) = 0;
    (__p->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (__p->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
    *(undefined8 *)&(__p->readEventCallback_).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(__p->readEventCallback_).super__Function_base._M_functor + 8) = 0;
    __p->readable_ = false;
    __p->writable_ = false;
    __p->old_readable_ = false;
    __p->old_writable_ = false;
    __p->fd_ = iVar2;
    __p->poller_ = pPVar6;
    if ((pPVar6 != (Poller *)0x0) && (-1 < iVar2)) {
      std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
                ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)&this->chan_
                 ,__p);
      return;
    }
    __assert_fail("fd >= 0 && poller",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Channel.h"
                  ,0xe,"Liby::Channel::Channel(Poller *, int)");
  }
  __assert_fail("poller_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.h"
                ,0xf,"Poller *Liby::EventLoop::getPoller() const");
}

Assistant:

UdpSocket::UdpSocket(EventLoop *loop, const SockPtr &socket)
    : sockfd_(socket->fd()), socket_(socket), poller_(loop->getPoller()),
      loop_(loop) {
    chan_ = std::make_unique<Channel>(poller_, sockfd_);
}